

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_var::dump(statement_var *this,ostream *o)

{
  ostream *poVar1;
  char *pcVar2;
  
  std::operator<<(o,"< Var: ");
  compiler_type::dump_expr((this->mTree).mRoot,o);
  pcVar2 = "";
  if (this->link != false) {
    pcVar2 = ", type = link";
  }
  poVar1 = std::operator<<(o,pcVar2);
  std::operator<<(poVar1," >\n");
  return;
}

Assistant:

void statement_var::dump(std::ostream &o) const
	{
		o << "< Var: ";
		compiler_type::dump_expr(mTree.root(), o);
		o << (link ? ", type = link" : "") << " >\n";
	}